

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_io_primitive_printLine
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  size_t __size;
  sysbvm_tuple_t string;
  size_t i;
  size_t parameterCount;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  sVar2 = sysbvm_array_getSize(*arguments);
  for (string = 0; string < sVar2; string = string + 1) {
    sVar3 = sysbvm_array_at(*arguments,string);
    sVar3 = sysbvm_tuple_asString(context,sVar3);
    _Var1 = sysbvm_tuple_isBytes(sVar3);
    if (!_Var1) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/io.c:107: assertion failure: sysbvm_tuple_isBytes(string)"
                );
    }
    __size = sysbvm_tuple_getSizeInBytes(sVar3);
    fwrite((void *)(sVar3 + 0x10),__size,1,_stdout);
  }
  fwrite("\n",1,1,_stdout);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_io_primitive_printLine(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    size_t parameterCount = sysbvm_array_getSize(arguments[0]);
    for(size_t i = 0; i < parameterCount; ++i)
    {
        sysbvm_tuple_t string = sysbvm_tuple_asString(context, sysbvm_array_at(arguments[0], i));
        SYSBVM_ASSERT(sysbvm_tuple_isBytes(string));
        fwrite(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes, sysbvm_tuple_getSizeInBytes(string), 1, stdout);

    }
    fwrite("\n", 1, 1, stdout);

    return SYSBVM_VOID_TUPLE;
}